

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O0

void __thiscall
eglu::GLContextFactory::GLContextFactory
          (GLContextFactory *this,NativeDisplayFactoryRegistry *displayFactoryRegistry)

{
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  NativeDisplayFactoryRegistry *local_18;
  NativeDisplayFactoryRegistry *displayFactoryRegistry_local;
  GLContextFactory *this_local;
  
  local_18 = displayFactoryRegistry;
  displayFactoryRegistry_local = (NativeDisplayFactoryRegistry *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"egl",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"EGL OpenGL Context",&local_71);
  glu::ContextFactory::ContextFactory(&this->super_ContextFactory,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_ContextFactory).super_FactoryBase.super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__GLContextFactory_00ca2c20;
  this->m_displayFactoryRegistry = local_18;
  return;
}

Assistant:

GLContextFactory::GLContextFactory (const NativeDisplayFactoryRegistry& displayFactoryRegistry)
	: glu::ContextFactory		("egl", "EGL OpenGL Context")
	, m_displayFactoryRegistry	(displayFactoryRegistry)
{
}